

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_capacity_valid_fn(int _i)

{
  size_t sVar1;
  int line;
  char *pcVar2;
  AString string;
  char *pcVar3;
  undefined8 uVar4;
  AString local_28;
  
  local_28.size = 0;
  local_28.reallocator = (ACUtilsReallocator)0x0;
  local_28.deallocator = (ACUtilsDeallocator)0x0;
  local_28.buffer = (char *)0x0;
  local_28.capacity = 0x2a;
  sVar1 = AString_capacity(&local_28);
  if (sVar1 == 0x2a) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x11b);
    local_28.capacity = 0xd;
    sVar1 = AString_capacity(&local_28);
    if (sVar1 == 0xd) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x11d);
      local_28.capacity = 0;
      sVar1 = AString_capacity(&local_28);
      if (sVar1 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x11f);
        return;
      }
      uVar4 = 0;
      pcVar3 = "0";
      pcVar2 = "AString_capacity(&string) == 0";
      line = 0x11f;
    }
    else {
      pcVar3 = "13";
      uVar4 = 0xd;
      pcVar2 = "AString_capacity(&string) == 13";
      line = 0x11d;
    }
  }
  else {
    pcVar3 = "42";
    uVar4 = 0x2a;
    pcVar2 = "AString_capacity(&string) == 42";
    line = 0x11b;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar2,
                    "AString_capacity(&string)",sVar1,pcVar3,uVar4,0);
}

Assistant:

START_TEST(test_AString_capacity_valid)
{
    struct AString string = {nullptr, nullptr};
    string.capacity = 42;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 42);
    string.capacity = 13;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 13);
    string.capacity = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 0);
}